

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

bool flatbuffers::EscapeString
               (char *s,size_t length,string *_text,bool allow_non_utf8,bool natural_utf8)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  int mask;
  uint uVar4;
  uint uVar5;
  undefined7 in_register_00000009;
  ulong uVar6;
  int iVar7;
  char *pcVar8;
  uint uVar9;
  string *psVar10;
  undefined3 in_register_00000081;
  bool bVar11;
  string local_78;
  string *local_58;
  undefined4 local_50;
  undefined4 local_4c;
  char *local_48;
  ulong local_40;
  size_t local_38;
  
  local_4c = CONCAT31(in_register_00000081,natural_utf8);
  std::__cxx11::string::append((char *)_text);
  bVar11 = length == 0;
  local_38 = length;
  if (!bVar11) {
    local_50 = (undefined4)CONCAT71(in_register_00000009,allow_non_utf8);
    local_40 = ~(ulong)s;
    local_48 = s + 2;
    uVar6 = 0;
    local_58 = _text;
    do {
      psVar10 = local_58;
      iVar7 = (int)uVar6;
      bVar2 = s[uVar6];
      switch(bVar2) {
      case 8:
        break;
      case 9:
        break;
      case 10:
        break;
      case 0xb:
switchD_0014a9ea_caseD_b:
        if ((byte)(bVar2 - 0x20) < 0x5f) {
          std::__cxx11::string::push_back((char)_text);
          psVar10 = _text;
          goto LAB_0014aa65;
        }
        pcVar1 = s + uVar6;
        uVar6 = 0;
        uVar4 = 0x80;
        do {
          if ((uVar4 & bVar2) == 0) goto LAB_0014aaa7;
          uVar5 = (int)uVar6 + 1;
          uVar6 = (ulong)uVar5;
          uVar4 = uVar4 >> 1;
        } while (uVar5 != 6);
        uVar6 = 6;
LAB_0014aaa7:
        uVar5 = (uint)uVar6;
        uVar9 = 0xffffffff;
        pcVar8 = pcVar1;
        uVar4 = uVar5;
        if (-1 < (char)(bVar2 << ((byte)uVar6 & 0x1f))) {
          if (uVar6 == 0) {
            uVar9 = (uint)(char)bVar2;
            pcVar8 = pcVar1 + 1;
          }
          else {
            uVar4 = (uint)CONCAT71((int7)(uVar6 >> 8),uVar6 == 1);
            if (uVar5 < 5 && uVar6 != 1) {
              uVar9 = 0xffffffff;
              pcVar8 = pcVar1 + 1;
              uVar4 = (uint)(byte)-(pcVar1[1] & 0xc0U);
            }
          }
        }
        if ((int)uVar9 < 0) {
          if ((char)local_50 != '\0') {
            std::__cxx11::string::append((char *)local_58);
            IntToStringHex_abi_cxx11_(&local_78,(flatbuffers *)(ulong)(uint)bVar2,2,uVar4);
            std::__cxx11::string::_M_append((char *)psVar10,(ulong)local_78._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            goto LAB_0014aa65;
          }
          bVar3 = false;
          _text = local_58;
        }
        else {
          if ((char)local_4c == '\0') {
            if ((int)uVar9 < 0x10000) {
              std::__cxx11::string::append((char *)local_58);
              IntToStringHex_abi_cxx11_(&local_78,(flatbuffers *)(ulong)uVar9,4,uVar4);
              std::__cxx11::string::_M_append((char *)psVar10,(ulong)local_78._M_dataplus._M_p);
            }
            else {
              if (0x10ffff < (int)uVar9) goto LAB_0014acf1;
              std::__cxx11::string::append((char *)local_58);
              IntToStringHex_abi_cxx11_
                        (&local_78,(flatbuffers *)(ulong)((uVar9 - 0x10000 >> 10) + 0xd800),4,uVar4)
              ;
              std::__cxx11::string::_M_append((char *)psVar10,(ulong)local_78._M_dataplus._M_p);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              psVar10 = local_58;
              std::__cxx11::string::append((char *)local_58);
              IntToStringHex_abi_cxx11_
                        (&local_78,(flatbuffers *)(ulong)(uVar9 & 0x3ff | 0xdc00),4,uVar4);
              std::__cxx11::string::_M_append((char *)psVar10,(ulong)local_78._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != &local_78.field_2) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
          }
          else {
            std::__cxx11::string::append((char *)local_58,(ulong)pcVar1);
          }
LAB_0014acf1:
          iVar7 = (int)pcVar8 + (int)local_40;
          bVar3 = true;
          _text = local_58;
        }
        goto LAB_0014aa67;
      case 0xc:
        break;
      case 0xd:
        break;
      default:
        if ((bVar2 != 0x22) && (bVar2 != 0x5c)) goto switchD_0014a9ea_caseD_b;
      }
      std::__cxx11::string::append((char *)_text);
      psVar10 = _text;
LAB_0014aa65:
      bVar3 = true;
      _text = psVar10;
LAB_0014aa67:
      if (!bVar3) {
        return bVar11;
      }
      uVar6 = (ulong)(iVar7 + 1);
      bVar11 = uVar6 >= local_38;
    } while (uVar6 < local_38);
  }
  std::__cxx11::string::append((char *)_text);
  return bVar11;
}

Assistant:

inline bool EscapeString(const char *s, size_t length, std::string *_text,
                         bool allow_non_utf8, bool natural_utf8) {
  std::string &text = *_text;
  text += "\"";
  for (uoffset_t i = 0; i < length; i++) {
    char c = s[i];
    switch (c) {
      case '\n': text += "\\n"; break;
      case '\t': text += "\\t"; break;
      case '\r': text += "\\r"; break;
      case '\b': text += "\\b"; break;
      case '\f': text += "\\f"; break;
      case '\"': text += "\\\""; break;
      case '\\': text += "\\\\"; break;
      default:
        if (c >= ' ' && c <= '~') {
          text += c;
        } else {
          // Not printable ASCII data. Let's see if it's valid UTF-8 first:
          const char *utf8 = s + i;
          int ucc = FromUTF8(&utf8);
          if (ucc < 0) {
            if (allow_non_utf8) {
              text += "\\x";
              text += IntToStringHex(static_cast<uint8_t>(c), 2);
            } else {
              // There are two cases here:
              //
              // 1) We reached here by parsing an IDL file. In that case,
              // we previously checked for non-UTF-8, so we shouldn't reach
              // here.
              //
              // 2) We reached here by someone calling GenText()
              // on a previously-serialized flatbuffer. The data might have
              // non-UTF-8 Strings, or might be corrupt.
              //
              // In both cases, we have to give up and inform the caller
              // they have no JSON.
              return false;
            }
          } else {
            if (natural_utf8) {
              // utf8 points to past all utf-8 bytes parsed
              text.append(s + i, static_cast<size_t>(utf8 - s - i));
            } else if (ucc <= 0xFFFF) {
              // Parses as Unicode within JSON's \uXXXX range, so use that.
              text += "\\u";
              text += IntToStringHex(ucc, 4);
            } else if (ucc <= 0x10FFFF) {
              // Encode Unicode SMP values to a surrogate pair using two \u
              // escapes.
              uint32_t base = ucc - 0x10000;
              auto high_surrogate = (base >> 10) + 0xD800;
              auto low_surrogate = (base & 0x03FF) + 0xDC00;
              text += "\\u";
              text += IntToStringHex(high_surrogate, 4);
              text += "\\u";
              text += IntToStringHex(low_surrogate, 4);
            }
            // Skip past characters recognized.
            i = static_cast<uoffset_t>(utf8 - s - 1);
          }
        }
        break;
    }
  }
  text += "\"";
  return true;
}